

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# romfs.cpp
# Opt level: O3

int __thiscall pstore::romfs::romfs::open(romfs *this,char *__file,int __oflag,...)

{
  dirent *pdVar1;
  error_code *peVar2;
  not_null<const_pstore::romfs::dirent_*> *pnVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  descriptor *pdVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  error_code eVar5;
  error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_> local_40;
  
  parse_path(&local_40,(romfs *)__file,___oflag,*(directory **)(__file + 8));
  if (local_40.has_error_ == false) {
    pnVar3 = error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
             value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
                       (&local_40);
    pdVar1 = pnVar3->ptr_;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00159920;
    this_00[1]._vptr__Sp_counted_base = (_func_int **)pdVar1;
    this_00[1]._M_use_count = 0;
    this_00[1]._M_weak_count = 0;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = 2;
    }
    *(undefined1 *)&this[1].root_.ptr_ = 0;
    pdVar4 = error_or<pstore::romfs::descriptor>::
             value_storage_impl<pstore::error_or<pstore::romfs::descriptor>&,pstore::romfs::descriptor>
                       ((error_or<pstore::romfs::descriptor> *)this);
    (pdVar4->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(this_00 + 1);
    (pdVar4->f_).super___shared_ptr<pstore::romfs::open_file,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = this_00;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  else {
    eVar5 = error_or<pstore::gsl::not_null<const_pstore::romfs::dirent_*>_>::get_error(&local_40);
    *(undefined1 *)&this[1].root_.ptr_ = 1;
    peVar2 = error_or<pstore::romfs::descriptor>::
             error_storage_impl<pstore::error_or<pstore::romfs::descriptor>&,std::error_code>
                       ((error_or<pstore::romfs::descriptor> *)this);
    peVar2->_M_value = eVar5._M_value;
    peVar2->_M_cat = eVar5._M_cat;
  }
  if (local_40.has_error_ == false) {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    value_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,pstore::gsl::not_null<pstore::romfs::dirent_const*>>
              (&local_40);
  }
  else {
    error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>::
    error_storage_impl<pstore::error_or<pstore::gsl::not_null<pstore::romfs::dirent_const*>>&,std::error_code>
              (&local_40);
  }
  return (int)this;
}

Assistant:

auto romfs::open (not_null<czstring> const path) const -> error_or<descriptor> {
            return this->parse_path (path) >>= [] (dirent_ptr const de) {
                auto const file = std::make_shared<open_file> (*de);
                return error_or<descriptor>{descriptor{file}};
            };
        }